

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

void xmlRegisterDefaultInputCallbacks(void)

{
  xmlRegisterInputCallbacks
            (xmlIODefaultMatch,(xmlInputOpenCallback)0x0,(xmlInputReadCallback)0x0,
             (xmlInputCloseCallback)0x0);
  return;
}

Assistant:

void
xmlRegisterDefaultInputCallbacks(void) {
    xmlRegisterInputCallbacks(xmlIODefaultMatch, NULL, NULL, NULL);
}